

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# brotli_bit_stream.cpp
# Opt level: O1

void duckdb_brotli::BrotliStoreMetaBlockFast
               (MemoryManager *m,uint8_t *input,size_t start_pos,size_t length,size_t mask,
               int is_last,BrotliEncoderParams *params,Command *commands,size_t n_commands,
               size_t *storage_ix,uint8_t *storage)

{
  HistogramCommand *cmd_histo;
  HistogramDistance *dist_histo;
  HuffmanTree *tree;
  uint32_t uVar1;
  uint uVar2;
  HistogramLiteral *lit_histo;
  size_t sVar3;
  ulong uVar4;
  ulong uVar5;
  uint uVar6;
  size_t histogram_total;
  uint32_t histogram [256];
  
  lit_histo = (HistogramLiteral *)BrotliAllocate(m,0x50a0);
  uVar1 = (params->dist).alphabet_size_max;
  StoreCompressedMetaBlockHeader(is_last,length,storage_ix,storage);
  uVar5 = *storage_ix;
  uVar4 = uVar5 >> 3;
  *(ulong *)(storage + uVar4) = (ulong)storage[uVar4];
  *storage_ix = uVar5 + 0xd;
  if (n_commands < 0x81) {
    histogram_total = 0;
    switchD_0105b559::default(histogram,0,0x400);
    if (n_commands != 0) {
      sVar3 = 0;
      histogram_total = 0;
      uVar5 = start_pos;
      do {
        uVar2 = commands[sVar3].insert_len_;
        for (uVar4 = (ulong)uVar2; uVar4 != 0; uVar4 = uVar4 - 1) {
          histogram[input[uVar5 & mask]] = histogram[input[uVar5 & mask]] + 1;
          uVar5 = uVar5 + 1;
        }
        histogram_total = histogram_total + uVar2;
        uVar5 = uVar5 + (commands[sVar3].copy_len_ & 0x1ffffff);
        sVar3 = sVar3 + 1;
      } while (sVar3 != n_commands);
    }
    BrotliBuildAndStoreHuffmanTreeFast
              ((HuffmanTree *)(lit_histo[9].data_ + 1),histogram,histogram_total,8,
               (uint8_t *)(lit_histo[5].data_ + 0xd8),(uint16_t *)(lit_histo[6].data_ + 0x14),
               storage_ix,storage);
    uVar4 = *storage_ix;
    *(ulong *)(storage + (uVar4 >> 3)) =
         0x92624416307003 << ((byte)uVar4 & 7) | (ulong)storage[uVar4 >> 3];
    *storage_ix = uVar4 + 0x38;
    uVar5 = uVar4 + 0x38 >> 3;
    *(ulong *)(storage + uVar5) = (ulong)storage[uVar5];
    uVar5 = uVar4 + 0x3b;
    *storage_ix = uVar5;
    *(ulong *)(storage + (uVar5 >> 3)) =
         0x369dc03L << ((byte)uVar5 & 7) | (ulong)storage[uVar5 >> 3];
    *storage_ix = uVar4 + 0x57;
    StoreDataWithHuffmanCodes
              (input,start_pos,mask,commands,n_commands,(uint8_t *)(lit_histo[5].data_ + 0xd8),
               (uint16_t *)(lit_histo[6].data_ + 0x14),kStaticCommandCodeDepth,
               (uint16_t *)kStaticCommandCodeBits,kStaticDistanceCodeDepth,
               (uint16_t *)kStaticDistanceCodeBits,storage_ix,storage);
  }
  else {
    uVar6 = uVar1 - 1;
    uVar2 = 0x1f;
    if (uVar6 != 0) {
      for (; uVar6 >> uVar2 == 0; uVar2 = uVar2 - 1) {
      }
    }
    switchD_0105b559::default(lit_histo,0,0x408);
    lit_histo->bit_cost_ = INFINITY;
    cmd_histo = (HistogramCommand *)(lit_histo + 1);
    switchD_0105b559::default(cmd_histo,0,0xb08);
    lit_histo[3].data_[0xba] = 0;
    lit_histo[3].data_[0xbb] = 0x7ff00000;
    dist_histo = (HistogramDistance *)(lit_histo[3].data_ + 0xbc);
    switchD_0105b559::default(dist_histo,0,0x888);
    lit_histo[5].data_[0xd6] = 0;
    lit_histo[5].data_[0xd7] = 0x7ff00000;
    BuildHistograms(input,start_pos,mask,commands,n_commands,lit_histo,cmd_histo,dist_histo);
    tree = (HuffmanTree *)(lit_histo[9].data_ + 1);
    BrotliBuildAndStoreHuffmanTreeFast
              (tree,(uint32_t *)lit_histo,lit_histo->total_count_,8,
               (uint8_t *)(lit_histo[5].data_ + 0xd8),(uint16_t *)(lit_histo[6].data_ + 0x14),
               storage_ix,storage);
    BrotliBuildAndStoreHuffmanTreeFast
              (tree,(uint32_t *)cmd_histo,*(size_t *)(lit_histo[3].data_ + 0xb8),10,
               (uint8_t *)(lit_histo[6].data_ + 0x94),(uint16_t *)(lit_histo[7].data_ + 0x40),
               storage_ix,storage);
    BrotliBuildAndStoreHuffmanTreeFast
              (tree,(uint32_t *)dist_histo,*(size_t *)(lit_histo[5].data_ + 0xd4),
               (ulong)((uVar2 ^ 0xffffffe0) + 0x21),(uint8_t *)(lit_histo[8].data_ + 0x9c),
               (uint16_t *)(lit_histo[8].data_ + 0xbf),storage_ix,storage);
    StoreDataWithHuffmanCodes
              (input,start_pos,mask,commands,n_commands,(uint8_t *)(lit_histo[5].data_ + 0xd8),
               (uint16_t *)(lit_histo[6].data_ + 0x14),(uint8_t *)(lit_histo[6].data_ + 0x94),
               (uint16_t *)(lit_histo[7].data_ + 0x40),(uint8_t *)(lit_histo[8].data_ + 0x9c),
               (uint16_t *)(lit_histo[8].data_ + 0xbf),storage_ix,storage);
  }
  BrotliFree(m,lit_histo);
  if (is_last != 0) {
    uVar2 = (int)*storage_ix + 7;
    *storage_ix = (ulong)(uVar2 & 0xfffffff8);
    storage[uVar2 >> 3] = '\0';
  }
  return;
}

Assistant:

void duckdb_brotli::BrotliStoreMetaBlockFast(MemoryManager* m,
    const uint8_t* input, size_t start_pos, size_t length, size_t mask,
    BROTLI_BOOL is_last, const BrotliEncoderParams* params,
    const Command* commands, size_t n_commands,
    size_t* storage_ix, uint8_t* storage) {
  MetablockArena* arena = BROTLI_ALLOC(m, MetablockArena, 1);
  uint32_t num_distance_symbols = params->dist.alphabet_size_max;
  uint32_t distance_alphabet_bits =
      Log2FloorNonZero(num_distance_symbols - 1) + 1;
  if (BROTLI_IS_OOM(m) || BROTLI_IS_NULL(arena)) return;

  StoreCompressedMetaBlockHeader(is_last, length, storage_ix, storage);

  BrotliWriteBits(13, 0, storage_ix, storage);

  if (n_commands <= 128) {
    uint32_t histogram[BROTLI_NUM_LITERAL_SYMBOLS] = { 0 };
    size_t pos = start_pos;
    size_t num_literals = 0;
    size_t i;
    for (i = 0; i < n_commands; ++i) {
      const Command cmd = commands[i];
      size_t j;
      for (j = cmd.insert_len_; j != 0; --j) {
        ++histogram[input[pos & mask]];
        ++pos;
      }
      num_literals += cmd.insert_len_;
      pos += CommandCopyLen(&cmd);
    }
    BrotliBuildAndStoreHuffmanTreeFast(arena->tree, histogram, num_literals,
                                       /* max_bits = */ 8,
                                       arena->lit_depth, arena->lit_bits,
                                       storage_ix, storage);
    StoreStaticCommandHuffmanTree(storage_ix, storage);
    StoreStaticDistanceHuffmanTree(storage_ix, storage);
    StoreDataWithHuffmanCodes(input, start_pos, mask, commands,
                              n_commands, arena->lit_depth, arena->lit_bits,
                              kStaticCommandCodeDepth,
                              kStaticCommandCodeBits,
                              kStaticDistanceCodeDepth,
                              kStaticDistanceCodeBits,
                              storage_ix, storage);
  } else {
    HistogramClearLiteral(&arena->lit_histo);
    HistogramClearCommand(&arena->cmd_histo);
    HistogramClearDistance(&arena->dist_histo);
    BuildHistograms(input, start_pos, mask, commands, n_commands,
                    &arena->lit_histo, &arena->cmd_histo, &arena->dist_histo);
    BrotliBuildAndStoreHuffmanTreeFast(arena->tree, arena->lit_histo.data_,
                                       arena->lit_histo.total_count_,
                                       /* max_bits = */ 8,
                                       arena->lit_depth, arena->lit_bits,
                                       storage_ix, storage);
    BrotliBuildAndStoreHuffmanTreeFast(arena->tree, arena->cmd_histo.data_,
                                       arena->cmd_histo.total_count_,
                                       /* max_bits = */ 10,
                                       arena->cmd_depth, arena->cmd_bits,
                                       storage_ix, storage);
    BrotliBuildAndStoreHuffmanTreeFast(arena->tree, arena->dist_histo.data_,
                                       arena->dist_histo.total_count_,
                                       /* max_bits = */
                                       distance_alphabet_bits,
                                       arena->dist_depth, arena->dist_bits,
                                       storage_ix, storage);
    StoreDataWithHuffmanCodes(input, start_pos, mask, commands,
                              n_commands, arena->lit_depth, arena->lit_bits,
                              arena->cmd_depth, arena->cmd_bits,
                              arena->dist_depth, arena->dist_bits,
                              storage_ix, storage);
  }

  BROTLI_FREE(m, arena);

  if (is_last) {
    JumpToByteBoundary(storage_ix, storage);
  }
}